

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

char * Ndr_ObjWriteConstant(uint *pBits,int nBits)

{
  int iVar1;
  size_t sVar2;
  int local_1c;
  int local_18;
  int Len;
  int i;
  int nBits_local;
  uint *pBits_local;
  
  if (nBits + 10 < 10000) {
    sprintf(Ndr_ObjWriteConstant::Buffer,"%d\'b",(ulong)(uint)nBits);
    sVar2 = strlen(Ndr_ObjWriteConstant::Buffer);
    local_1c = (int)sVar2;
    for (local_18 = nBits + -1; -1 < local_18; local_18 = local_18 + -1) {
      iVar1 = Abc_InfoHasBit(pBits,local_18);
      Ndr_ObjWriteConstant::Buffer[local_1c] = (char)iVar1 + '0';
      local_1c = local_1c + 1;
    }
    Ndr_ObjWriteConstant::Buffer[local_1c] = '\0';
    return Ndr_ObjWriteConstant::Buffer;
  }
  __assert_fail("nBits + 10 < 10000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                ,0xb6,"char *Ndr_ObjWriteConstant(unsigned int *, int)");
}

Assistant:

char * Ndr_ObjWriteConstant( unsigned * pBits, int nBits )
{
    static char Buffer[10000]; int i, Len;
    assert( nBits + 10 < 10000 );
    sprintf( Buffer, "%d\'b", nBits );
    Len = strlen(Buffer);
    for ( i = nBits-1; i >= 0; i-- )
        Buffer[Len++] = '0' + Abc_InfoHasBit(pBits, i);
    Buffer[Len] = 0;
    return Buffer;
}